

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

void __thiscall cli::Parser::enable_help(Parser *this)

{
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"h",&local_89);
  std::__cxx11::string::string((string *)&local_48,"help",&local_8a);
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<bool_(cli::CallbackArgs_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/contrib/cmdparser/cmdparser.hpp:234:65)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(cli::CallbackArgs_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/contrib/cmdparser/cmdparser.hpp:234:65)>
             ::_M_manager;
  local_88._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_68,"",&local_8b);
  set_callback<bool>(this,&local_28,&local_48,(function<bool_(cli::CallbackArgs_&)> *)&local_88,
                     &local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void enable_help() {
			set_callback("h", "help", std::function<bool(CallbackArgs&)>([this](CallbackArgs& args){
				args.output << this->usage();
				throw std::bad_cast();
				return false;
			}));
		}